

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

FieldGroup<Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
 Fixpp::
 createGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::VersionnedMessage<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::Int>>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>,Fixpp::TagT<141u,Fixpp::Type::Boolean>,Fixpp::TagT<383u,Fixpp::Type::Int>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
           (VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
            *message,size_t size)

{
  bool *pbVar1;
  type_by_index_t<6UL,_Fixpp::Field<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<95U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<96U,_Fixpp::Type::Data>_>,_Fixpp::Field<Fixpp::TagT<141U,_Fixpp::Type::Boolean>_>,_Fixpp::Field<Fixpp::TagT<383U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
  *this;
  FieldGroup<Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
  FVar2;
  type_by_index_t<6UL,_Fixpp::Field<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<95U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<96U,_Fixpp::Type::Data>_>,_Fixpp::Field<Fixpp::TagT<141U,_Fixpp::Type::Boolean>_>,_Fixpp::Field<Fixpp::TagT<383U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
  *group;
  size_t size_local;
  VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  *message_local;
  
  pbVar1 = identity<bool>(&details::
                           TagIndex<meta::typelist::TypeList<Fixpp::TagT<98U,_Fixpp::Type::Int>,_meta::typelist::TypeList<Fixpp::TagT<108U,_Fixpp::Type::Int>,_meta::typelist::NullType>_>,_Fixpp::TagT<384U,_Fixpp::Type::Int>_>
                           ::Valid);
  if ((*pbVar1 & 1U) != 0) {
    std::bitset<2UL>::set
              (&(message->
                super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                ).
                super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                .requiredBits,0xffffffffffffffff,true);
  }
  this = meta::
         get<6ul,Fixpp::Field<Fixpp::TagT<98u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<108u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<95u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<96u,Fixpp::Type::Data>>,Fixpp::Field<Fixpp::TagT<141u,Fixpp::Type::Boolean>>,Fixpp::Field<Fixpp::TagT<383u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
                   ((tuple<Fixpp::Field<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<95U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<96U,_Fixpp::Type::Data>_>,_Fixpp::Field<Fixpp::TagT<141U,_Fixpp::Type::Boolean>_>,_Fixpp::Field<Fixpp::TagT<383U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                     *)message);
  Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  ::reserve(this,size);
  FVar2 = makeGroup<Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
                    (this);
  return (FieldGroup<Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
          )FVar2.field;
}

Assistant:

decltype(auto)
    createGroup(Message& message, size_t size)
    {
        using GroupIndex = details::TagIndex<typename Message::TagsList, Tag>;
        using RequiredIndex = details::TagIndex<typename Message::RequiredList, Tag>;

        static_assert(GroupIndex::Valid, "Invalid RepeatingGroup for given message");

        if (identity(RequiredIndex::Valid))
            message.requiredBits.set(static_cast<size_t>(RequiredIndex::Value));

        auto& group = meta::get<GroupIndex::Value>(message.values);
        group.reserve(size);

        return makeGroup(group);
    }